

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::ComputeItemParserInfo(cmComputeLinkInformation *this)

{
  cmMakefile *this_00;
  string *psVar1;
  cmValue cVar2;
  _Base_ptr p_Var3;
  string *i_1;
  pointer pbVar4;
  string *i;
  pointer e;
  string_view arg;
  string_view arg_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkSuffixVec;
  string reg;
  cmAlphaNum local_e0;
  string libext;
  string local_90;
  string reg_static;
  string reg_any;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkSuffixVec,"CMAKE_STATIC_LIBRARY_PREFIX",(allocator<char> *)&local_e0);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,(string *)&linkSuffixVec);
  AddLinkPrefix(this,psVar1);
  std::__cxx11::string::~string((string *)&linkSuffixVec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkSuffixVec,"CMAKE_SHARED_LIBRARY_PREFIX",(allocator<char> *)&local_e0);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,(string *)&linkSuffixVec);
  AddLinkPrefix(this,psVar1);
  std::__cxx11::string::~string((string *)&linkSuffixVec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkSuffixVec,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)&local_e0);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,(string *)&linkSuffixVec);
  AddLinkExtension(this,psVar1,LinkShared);
  std::__cxx11::string::~string((string *)&linkSuffixVec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkSuffixVec,"CMAKE_STATIC_LIBRARY_SUFFIX",(allocator<char> *)&local_e0);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,(string *)&linkSuffixVec);
  AddLinkExtension(this,psVar1,LinkStatic);
  std::__cxx11::string::~string((string *)&linkSuffixVec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkSuffixVec,"CMAKE_SHARED_LIBRARY_SUFFIX",(allocator<char> *)&local_e0);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,(string *)&linkSuffixVec);
  AddLinkExtension(this,psVar1,LinkShared);
  std::__cxx11::string::~string((string *)&linkSuffixVec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkSuffixVec,"CMAKE_LINK_LIBRARY_SUFFIX",(allocator<char> *)&local_e0);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,(string *)&linkSuffixVec);
  AddLinkExtension(this,psVar1,LinkUnknown);
  std::__cxx11::string::~string((string *)&linkSuffixVec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkSuffixVec,"CMAKE_EXTRA_LINK_EXTENSIONS",(allocator<char> *)&local_e0);
  cVar2 = cmMakefile::GetDefinition(this_00,(string *)&linkSuffixVec);
  std::__cxx11::string::~string((string *)&linkSuffixVec);
  if (cVar2.Value != (string *)0x0) {
    arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar2.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&linkSuffixVec,arg,false);
    pbVar4 = linkSuffixVec.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (e = linkSuffixVec.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; e != pbVar4; e = e + 1) {
      AddLinkExtension(this,e,LinkUnknown);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkSuffixVec);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkSuffixVec,"CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES",
             (allocator<char> *)&local_e0);
  cVar2 = cmMakefile::GetDefinition(this_00,(string *)&linkSuffixVec);
  std::__cxx11::string::~string((string *)&linkSuffixVec);
  if (cVar2.Value != (string *)0x0) {
    arg_00._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg_00._M_len = (cVar2.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&linkSuffixVec,arg_00,false);
    for (pbVar4 = linkSuffixVec.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != linkSuffixVec.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      AddLinkExtension(this,pbVar4,LinkShared);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkSuffixVec);
  }
  CreateExtensionRegex(&libext,this,&this->LinkExtensions,LinkUnknown);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reg,"(.*)",(allocator<char> *)&linkSuffixVec);
  std::__cxx11::string::append((string *)&reg);
  cmOrderDirectories::SetLinkExtensionInfo
            ((this->OrderLinkerSearchPath)._M_t.
             super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
             super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,&this->LinkExtensions,
             &reg);
  std::__cxx11::string::assign((char *)&reg);
  for (p_Var3 = (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::append((string *)&reg);
    std::__cxx11::string::append((char *)&reg);
  }
  std::__cxx11::string::append((char *)&reg);
  std::__cxx11::string::append((char *)&reg);
  linkSuffixVec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)reg._M_string_length;
  linkSuffixVec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)reg._M_dataplus._M_p;
  local_e0.View_._M_len = libext._M_string_length;
  local_e0.View_._M_str = libext._M_dataplus._M_p;
  cmStrCat<>(&reg_any,(cmAlphaNum *)&linkSuffixVec,&local_e0);
  cmsys::RegularExpression::compile(&this->ExtractAnyLibraryName,reg_any._M_dataplus._M_p);
  if ((this->StaticLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->StaticLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    linkSuffixVec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)reg._M_string_length;
    linkSuffixVec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reg._M_dataplus._M_p;
    CreateExtensionRegex(&local_90,this,&this->StaticLinkExtensions,LinkStatic);
    local_e0.View_._M_len = local_90._M_string_length;
    local_e0.View_._M_str = local_90._M_dataplus._M_p;
    cmStrCat<>(&reg_static,(cmAlphaNum *)&linkSuffixVec,&local_e0);
    std::__cxx11::string::~string((string *)&local_90);
    cmsys::RegularExpression::compile(&this->ExtractStaticLibraryName,reg_static._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&reg_static);
  }
  if ((this->SharedLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->SharedLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&linkSuffixVec,(string *)&reg);
    CreateExtensionRegex((string *)&local_e0,this,&this->SharedLinkExtensions,LinkShared);
    std::__cxx11::string::operator=((string *)&this->SharedRegexString,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::append((string *)&linkSuffixVec);
    cmsys::RegularExpression::compile
              (&this->ExtractSharedLibraryName,
               (char *)linkSuffixVec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&linkSuffixVec);
  }
  std::__cxx11::string::~string((string *)&reg_any);
  std::__cxx11::string::~string((string *)&reg);
  std::__cxx11::string::~string((string *)&libext);
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeItemParserInfo()
{
  // Get possible library name prefixes.
  cmMakefile* mf = this->Makefile;
  this->AddLinkPrefix(mf->GetSafeDefinition("CMAKE_STATIC_LIBRARY_PREFIX"));
  this->AddLinkPrefix(mf->GetSafeDefinition("CMAKE_SHARED_LIBRARY_PREFIX"));

  // Import library names should be matched and treated as shared
  // libraries for the purposes of linking.
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_STATIC_LIBRARY_SUFFIX"),
                         LinkStatic);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_SHARED_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX"),
                         LinkUnknown);
  if (cmValue linkSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_LINK_EXTENSIONS")) {
    std::vector<std::string> linkSuffixVec = cmExpandedList(*linkSuffixes);
    for (std::string const& i : linkSuffixVec) {
      this->AddLinkExtension(i, LinkUnknown);
    }
  }
  if (cmValue sharedSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES")) {
    std::vector<std::string> sharedSuffixVec = cmExpandedList(*sharedSuffixes);
    for (std::string const& i : sharedSuffixVec) {
      this->AddLinkExtension(i, LinkShared);
    }
  }

  // Compute a regex to match link extensions.
  std::string libext =
    this->CreateExtensionRegex(this->LinkExtensions, LinkUnknown);

  // Create regex to remove any library extension.
  std::string reg("(.*)");
  reg += libext;
  this->OrderLinkerSearchPath->SetLinkExtensionInfo(this->LinkExtensions, reg);

  // Create a regex to match a library name.  Match index 1 will be
  // the prefix if it exists and empty otherwise.  Match index 2 will
  // be the library name.  Match index 3 will be the library
  // extension.
  reg = "^(";
  for (std::string const& p : this->LinkPrefixes) {
    reg += p;
    reg += "|";
  }
  reg += ")";
  reg += "([^/:]*)";

  // Create a regex to match any library name.
  std::string reg_any = cmStrCat(reg, libext);
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "any regex [%s]\n", reg_any.c_str());
#endif
  this->ExtractAnyLibraryName.compile(reg_any);

  // Create a regex to match static library names.
  if (!this->StaticLinkExtensions.empty()) {
    std::string reg_static = cmStrCat(
      reg, this->CreateExtensionRegex(this->StaticLinkExtensions, LinkStatic));
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex [%s]\n", reg_static.c_str());
#endif
    this->ExtractStaticLibraryName.compile(reg_static);
  }

  // Create a regex to match shared library names.
  if (!this->SharedLinkExtensions.empty()) {
    std::string reg_shared = reg;
    this->SharedRegexString =
      this->CreateExtensionRegex(this->SharedLinkExtensions, LinkShared);
    reg_shared += this->SharedRegexString;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex [%s]\n", reg_shared.c_str());
#endif
    this->ExtractSharedLibraryName.compile(reg_shared);
  }
}